

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QAbstractItemModelPrivate::Change>::reallocateAndGrow
          (QArrayDataPointer<QAbstractItemModelPrivate::Change> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QAbstractItemModelPrivate::Change> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  Change *pCVar3;
  undefined1 *puVar4;
  quintptr qVar5;
  undefined7 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Change *data;
  long lVar11;
  Change *pCVar12;
  Change *pCVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0 && where == GrowsAtEnd)
       && (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::reallocate
                ((QMovableArrayOps<QAbstractItemModelPrivate::Change> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Change *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (Change *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar11 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) ||
            (old != (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar11) {
            pCVar12 = this->ptr;
            pCVar3 = pCVar12 + lVar11;
            pCVar13 = local_48.ptr + local_48.size;
            do {
              uVar6 = *(undefined7 *)&pCVar12->field_0x21;
              pCVar13->needsAdjust = pCVar12->needsAdjust;
              *(undefined7 *)&pCVar13->field_0x21 = uVar6;
              iVar9 = (pCVar12->parent).r;
              iVar10 = (pCVar12->parent).c;
              qVar5 = (pCVar12->parent).i;
              iVar7 = pCVar12->first;
              iVar8 = pCVar12->last;
              (pCVar13->parent).m.ptr = (pCVar12->parent).m.ptr;
              pCVar13->first = iVar7;
              pCVar13->last = iVar8;
              (pCVar13->parent).r = iVar9;
              (pCVar13->parent).c = iVar10;
              (pCVar13->parent).i = qVar5;
              pCVar12 = pCVar12 + 1;
              local_48.size = local_48.size + 1;
              pCVar13 = pCVar13 + 1;
            } while (pCVar12 < pCVar3);
          }
        }
        else if (0 < lVar11) {
          pCVar12 = this->ptr;
          pCVar3 = pCVar12 + lVar11;
          pCVar13 = local_48.ptr + local_48.size;
          do {
            uVar6 = *(undefined7 *)&pCVar12->field_0x21;
            pCVar13->needsAdjust = pCVar12->needsAdjust;
            *(undefined7 *)&pCVar13->field_0x21 = uVar6;
            iVar9 = (pCVar12->parent).r;
            iVar10 = (pCVar12->parent).c;
            qVar5 = (pCVar12->parent).i;
            iVar7 = pCVar12->first;
            iVar8 = pCVar12->last;
            (pCVar13->parent).m.ptr = (pCVar12->parent).m.ptr;
            pCVar13->first = iVar7;
            pCVar13->last = iVar8;
            (pCVar13->parent).r = iVar9;
            (pCVar13->parent).c = iVar10;
            (pCVar13->parent).i = qVar5;
            pCVar12 = pCVar12 + 1;
            local_48.size = local_48.size + 1;
            pCVar13 = pCVar13 + 1;
          } while (pCVar12 < pCVar3);
        }
      }
      pQVar2 = &this->d->super_QArrayData;
      this->d = local_48.d;
      pCVar3 = this->ptr;
      this->ptr = local_48.ptr;
      puVar4 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = (Data *)pQVar2;
      local_48.ptr = pCVar3;
      local_48.size = (qsizetype)puVar4;
      if (old != (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0) {
        local_48.d = old->d;
        old->d = (Data *)pQVar2;
        local_48.ptr = old->ptr;
        old->ptr = pCVar3;
        local_48.size = old->size;
        old->size = (qsizetype)puVar4;
      }
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x28,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }